

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qsqlrelationaltablemodel.cpp
# Opt level: O0

QVariant * __thiscall
QSqlRelationalTableModel::data(QSqlRelationalTableModel *this,QModelIndex *index,int role)

{
  bool bVar1;
  int iVar2;
  Op OVar3;
  QSqlRelationalTableModelPrivate *pQVar4;
  qsizetype qVar5;
  QRelation *this_00;
  QSqlRecord *this_01;
  QString *key;
  QVariant *pQVar6;
  int in_ECX;
  QModelIndex *in_RDX;
  QVariant *in_RDI;
  long in_FS_OFFSET;
  QSqlRelationalTableModelPrivate *d;
  QSharedPointer<QRelation> relation;
  ModifiedRow row;
  QVariant v;
  undefined4 in_stack_fffffffffffffed8;
  int in_stack_fffffffffffffedc;
  QRelation *in_stack_fffffffffffffee0;
  undefined8 in_stack_fffffffffffffee8;
  ModifiedRow *in_stack_fffffffffffffef0;
  CacheMap *this_02;
  QList<QSharedPointer<QRelation>_> *this_03;
  QRelation *in_stack_ffffffffffffff08;
  QModelIndex *in_stack_ffffffffffffff10;
  QVariant *this_04;
  ModifiedRow local_48;
  anon_union_24_3_e3d07ef4_for_data local_28;
  undefined8 local_10;
  long local_8;
  
  OVar3 = (Op)((ulong)in_stack_fffffffffffffee8 >> 0x20);
  local_8 = *(long *)(in_FS_OFFSET + 0x28);
  this_04 = in_RDI;
  pQVar4 = d_func((QSqlRelationalTableModel *)0x15964e);
  if ((in_ECX == 0) && (iVar2 = QModelIndex::column(in_RDX), -1 < iVar2)) {
    iVar2 = QModelIndex::column(in_RDX);
    in_stack_ffffffffffffff10 = (QModelIndex *)(long)iVar2;
    qVar5 = QList<QSharedPointer<QRelation>_>::size(&pQVar4->relations);
    if ((long)in_stack_ffffffffffffff10 < qVar5) {
      in_stack_ffffffffffffff08 = (QRelation *)&pQVar4->relations;
      QModelIndex::column(in_RDX);
      QList<QSharedPointer<QRelation>_>::at
                ((QList<QSharedPointer<QRelation>_> *)in_stack_fffffffffffffee0,
                 CONCAT44(in_stack_fffffffffffffedc,in_stack_fffffffffffffed8));
      QSharedPointer<QRelation>::operator->((QSharedPointer<QRelation> *)0x1596d3);
      bVar1 = QRelation::isValid(in_stack_fffffffffffffee0);
      if (bVar1) {
        this_03 = &pQVar4->relations;
        QModelIndex::column(in_RDX);
        QList<QSharedPointer<QRelation>_>::at
                  ((QList<QSharedPointer<QRelation>_> *)in_stack_fffffffffffffee0,
                   CONCAT44(in_stack_fffffffffffffedc,in_stack_fffffffffffffed8));
        QSharedPointer<QRelation>::QSharedPointer
                  ((QSharedPointer<QRelation> *)in_stack_fffffffffffffee0,
                   (QSharedPointer<QRelation> *)
                   CONCAT44(in_stack_fffffffffffffedc,in_stack_fffffffffffffed8));
        this_00 = QSharedPointer<QRelation>::operator->((QSharedPointer<QRelation> *)0x159746);
        bVar1 = QRelation::isDictionaryInitialized(this_00);
        if (!bVar1) {
          QSharedPointer<QRelation>::operator->((QSharedPointer<QRelation> *)0x15975f);
          QRelation::populateDictionary(in_stack_ffffffffffffff08);
        }
        if ((pQVar4->super_QSqlTableModelPrivate).strategy == OnFieldChange) {
LAB_001599c5:
          bVar1 = false;
        }
        else {
          local_48.m_op = 0xaaaaaaaa;
          local_48._4_4_ = 0xaaaaaaaa;
          local_48.m_rec.d.d.ptr =
               (QExplicitlySharedDataPointer<QSqlRecordPrivate>)
               (totally_ordered_wrapper<QSqlRecordPrivate_*>)0xaaaaaaaaaaaaaaaa;
          local_48.m_db_values.d.d.ptr =
               (QExplicitlySharedDataPointer<QSqlRecordPrivate>)
               (totally_ordered_wrapper<QSqlRecordPrivate_*>)0xaaaaaaaaaaaaaaaa;
          local_48.m_submitted = true;
          local_48.m_insert = true;
          local_48._26_6_ = 0xaaaaaaaaaaaa;
          this_02 = &(pQVar4->super_QSqlTableModelPrivate).cache;
          QModelIndex::row(in_RDX);
          QSqlRecord::QSqlRecord((QSqlRecord *)in_stack_fffffffffffffee0);
          QSqlTableModelPrivate::ModifiedRow::ModifiedRow
                    (in_stack_fffffffffffffef0,OVar3,(QSqlRecord *)in_stack_fffffffffffffee0);
          QMap<int,_QSqlTableModelPrivate::ModifiedRow>::value
                    ((QMap<int,_QSqlTableModelPrivate::ModifiedRow> *)this_03,(int *)this_02,
                     in_stack_fffffffffffffef0);
          QSqlTableModelPrivate::ModifiedRow::~ModifiedRow((ModifiedRow *)in_stack_fffffffffffffee0)
          ;
          QSqlRecord::~QSqlRecord((QSqlRecord *)0x159836);
          OVar3 = QSqlTableModelPrivate::ModifiedRow::op(&local_48);
          if (OVar3 == None) {
LAB_001599a4:
            bVar1 = false;
          }
          else {
            this_01 = QSqlTableModelPrivate::ModifiedRow::rec(&local_48);
            QModelIndex::column(in_RDX);
            bVar1 = QSqlRecord::isGenerated
                              ((QSqlRecord *)in_stack_fffffffffffffee0,in_stack_fffffffffffffedc);
            if ((!bVar1) ||
               (((pQVar4->super_QSqlTableModelPrivate).strategy != OnManualSubmit &&
                (OVar3 = QSqlTableModelPrivate::ModifiedRow::op(&local_48), OVar3 == Delete))))
            goto LAB_001599a4;
            local_28.shared = (PrivateShared *)0xaaaaaaaaaaaaaaaa;
            local_28._8_8_ = 0xaaaaaaaaaaaaaaaa;
            local_28._16_8_ = 0xaaaaaaaaaaaaaaaa;
            local_10 = 0xaaaaaaaaaaaaaaaa;
            key = (QString *)QSqlTableModelPrivate::ModifiedRow::rec(&local_48);
            QModelIndex::column(in_RDX);
            QSqlRecord::value((QSqlRecord *)this_02,(int)((ulong)this_01 >> 0x20));
            bVar1 = QVariant::isValid((QVariant *)in_stack_fffffffffffffee0);
            if (bVar1) {
              in_stack_fffffffffffffee0 =
                   QSharedPointer<QRelation>::operator->((QSharedPointer<QRelation> *)0x15992d);
              in_stack_fffffffffffffee0 = (QRelation *)&in_stack_fffffffffffffee0->dictionary;
              QVariant::toString();
              pQVar6 = QHash<QString,_QVariant>::operator[]((QHash<QString,_QVariant> *)this_01,key)
              ;
              QVariant::QVariant(this_04,(QVariant *)pQVar6);
              QString::~QString((QString *)0x159977);
            }
            QVariant::~QVariant((QVariant *)&local_28);
            if (!bVar1) goto LAB_001599a4;
          }
          QSqlTableModelPrivate::ModifiedRow::~ModifiedRow((ModifiedRow *)in_stack_fffffffffffffee0)
          ;
          if (bVar1 == false) goto LAB_001599c5;
        }
        QSharedPointer<QRelation>::~QSharedPointer((QSharedPointer<QRelation> *)0x1599da);
        if (bVar1 != false) goto LAB_00159a00;
      }
    }
  }
  QSqlTableModel::data
            ((QSqlTableModel *)this_04,in_stack_ffffffffffffff10,
             (int)((ulong)in_stack_ffffffffffffff08 >> 0x20));
LAB_00159a00:
  if (*(long *)(in_FS_OFFSET + 0x28) != local_8) {
    __stack_chk_fail();
  }
  return in_RDI;
}

Assistant:

QVariant QSqlRelationalTableModel::data(const QModelIndex &index, int role) const
{
    Q_D(const QSqlRelationalTableModel);

    if (role == Qt::DisplayRole && index.column() >= 0 && index.column() < d->relations.size() &&
            d->relations.at(index.column())->isValid()) {
        auto relation = d->relations.at(index.column());
        if (!relation->isDictionaryInitialized())
            relation->populateDictionary();

        //only perform a dictionary lookup for the display value
        //when the value at index has been changed or added.
        //At an unmodified index, the underlying model will
        //already have the correct display value.
        if (d->strategy != OnFieldChange) {
            const QSqlTableModelPrivate::ModifiedRow row = d->cache.value(index.row());
            if (row.op() != QSqlTableModelPrivate::None && row.rec().isGenerated(index.column())) {
                if (d->strategy == OnManualSubmit || row.op() != QSqlTableModelPrivate::Delete) {
                    QVariant v = row.rec().value(index.column());
                    if (v.isValid())
                        return relation->dictionary[v.toString()];
                }
            }
        }
    }
    return QSqlTableModel::data(index, role);
}